

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compress(void *dst,size_t dstCapacity,void *src,size_t srcSize,int compressionLevel)

{
  ZSTD_customMem memManager;
  size_t sVar1;
  ZSTD_CCtx ctxBody;
  ZSTD_CCtx local_4b8;
  
  memManager.opaque = (void *)0x0;
  memManager.customAlloc = (ZSTD_allocFunction)0x0;
  memManager.customFree = (ZSTD_freeFunction)0x0;
  ZSTD_initCCtx(&local_4b8,memManager);
  sVar1 = ZSTD_compressCCtx(&local_4b8,dst,dstCapacity,src,srcSize,compressionLevel);
  ZSTD_freeCCtxContent(&local_4b8);
  return sVar1;
}

Assistant:

size_t ZSTD_compress(void* dst, size_t dstCapacity,
               const void* src, size_t srcSize,
                     int compressionLevel)
{
    size_t result;
    ZSTD_CCtx ctxBody;
    ZSTD_initCCtx(&ctxBody, ZSTD_defaultCMem);
    result = ZSTD_compressCCtx(&ctxBody, dst, dstCapacity, src, srcSize, compressionLevel);
    ZSTD_freeCCtxContent(&ctxBody);   /* can't free ctxBody itself, as it's on stack; free only heap content */
    return result;
}